

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantOuterEdgeCase::iterate
          (InvariantOuterEdgeCase *this)

{
  Functional *outerLevels;
  ostringstream *poVar1;
  TessPrimitiveType primitiveType;
  TestLog *pTVar2;
  RenderContext *pRVar3;
  pointer pfVar4;
  pointer pfVar5;
  size_t sVar6;
  ulong uVar7;
  float *pfVar8;
  bool usePointMode;
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar14;
  uint uVar15;
  deUint32 tfPrimTypeGL;
  int wrapLengthParam;
  long lVar16;
  pointer this_00;
  ulong uVar17;
  float *__result;
  float *pfVar18;
  bool bVar19;
  ostringstream *poVar20;
  _Link_type __last1;
  int numIndentationSpaces;
  Functional *pFVar21;
  VertexArrayBinding *bindings_00;
  long lVar22;
  pointer pPVar23;
  float fVar24;
  float fVar25;
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  Vec3Set outerEdgeVertices;
  Result tfResult;
  RandomViewport viewport;
  Vec3Set firstOuterEdgeVertices;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  VertexArrayBinding bindings [1];
  Random rnd;
  vector<float,_std::allocator<float>_> patchTessLevels;
  TFHandler tfHandler;
  vector<float,_std::allocator<float>_> local_6b8;
  string local_6a0;
  string local_680;
  long local_660;
  pointer local_658;
  Functional *local_650;
  Functional *local_648;
  long local_640;
  undefined1 local_638 [40];
  size_t local_610;
  Result local_608;
  RandomViewport local_5e8;
  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  local_5d8;
  string local_5a8;
  ulong local_588;
  ulong local_580;
  long local_578;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  local_570;
  undefined1 local_558 [8];
  _Alloc_hider local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  int local_530;
  VertexArrayPointer local_528;
  undefined1 local_500 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0 [6];
  ios_base local_488 [264];
  undefined1 local_380 [16];
  pointer local_370;
  long local_368 [2];
  int local_358;
  ios_base local_308 [264];
  TransformFeedbackHandler<tcu::Vector<float,_3>_> local_200;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar10 = (*pRVar3->_vptr_RenderContext[4])(pRVar3);
  dVar11 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  uVar17 = (ulong)dVar11;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_5e8,(RenderTarget *)CONCAT44(extraout_var,iVar10),0x10,0x10,dVar11);
  iVar10 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  lVar22 = CONCAT44(extraout_var_00,iVar10);
  outerEdgeDescriptions(&local_570,this->m_primitiveType);
  lVar16 = 4;
  pfVar18 = iterate::singleOuterEdgeLevels;
  fVar24 = 1.0;
  do {
    fVar25 = *(float *)((long)iterate::singleOuterEdgeLevels + lVar16);
    pfVar8 = (float *)((long)iterate::singleOuterEdgeLevels + lVar16);
    if (fVar25 <= fVar24) {
      fVar25 = fVar24;
      pfVar8 = pfVar18;
    }
    pfVar18 = pfVar8;
    lVar16 = lVar16 + 4;
    fVar24 = fVar25;
  } while (lVar16 != 0x30);
  fVar24 = *pfVar18;
  deRandom_init((deRandom *)local_500,0x7b);
  iVar10 = 0;
  generateRandomPatchTessLevels
            ((vector<float,_std::allocator<float>_> *)local_380,10,0,fVar24,(Random *)local_500);
  usePointMode = false;
  bVar9 = true;
  do {
    bVar19 = bVar9;
    iVar12 = multiplePatchReferenceVertexCount
                       (this->m_primitiveType,this->m_spacing,usePointMode,(float *)local_380._0_8_,
                        (int)uVar17);
    if (iVar10 <= iVar12) {
      iVar10 = iVar12;
    }
    usePointMode = true;
    bVar9 = false;
  } while (bVar19);
  if ((TestLog *)local_380._0_8_ != (TestLog *)0x0) {
    operator_delete((void *)local_380._0_8_,(long)local_370 - local_380._0_8_);
  }
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&local_200,((this->super_TestCase).m_context)->m_renderCtx,iVar10);
  (**(code **)(lVar22 + 0x1a00))(local_5e8.x,local_5e8.y,local_5e8.width,local_5e8.height);
  (**(code **)(lVar22 + 0xfd8))(0x8e72);
  uVar15 = (uint)((ulong)((long)local_570.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_570.
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  local_658 = local_570.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
              ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)uVar15) {
    local_588 = (ulong)(uVar15 & 0x7fffffff);
    pfVar18 = (local_570.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
               ._M_impl.super__Vector_impl_data._M_start)->constantCoordinateValueChoices + 1;
    uVar17 = 0;
    local_660 = lVar22;
    do {
      this_00 = local_658 + uVar17;
      lVar16 = 0;
      local_580 = uVar17;
      do {
        fVar24 = iterate::singleOuterEdgeLevels[lVar16];
        local_578 = lVar16;
        deRandom_init((deRandom *)local_380,0x7b);
        generateRandomPatchTessLevels(&local_6b8,10,(int)uVar17,fVar24,(Random *)local_380);
        local_500._0_8_ = local_500 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"in_v_attr","");
        pfVar5 = local_6b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pfVar4 = local_6b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_380._0_4_ = 1;
        local_380._8_8_ = local_368;
        poVar20 = (ostringstream *)(local_380 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_380 + 8),local_500._0_8_,
                   (pointer)(local_500._0_8_ + local_500._8_8_));
        local_358 = 0;
        local_558._0_4_ = local_380._0_4_;
        local_550._M_p = (pointer)&local_540;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_550,local_380._8_8_,(long)local_370 + local_380._8_8_);
        local_530 = local_358;
        local_528.componentType = VTX_COMP_FLOAT;
        local_528.convert = VTX_COMP_CONVERT_NONE;
        local_528.numComponents = 1;
        local_528.numElements = (int)((ulong)((long)pfVar5 - (long)pfVar4) >> 2);
        local_528.stride = 0;
        local_528.data = pfVar4;
        if ((long *)local_380._8_8_ != local_368) {
          operator_delete((void *)local_380._8_8_,local_368[0] + 1);
        }
        if ((TestLog *)local_500._0_8_ != (TestLog *)(local_500 + 0x10)) {
          operator_delete((void *)local_500._0_8_,local_4f0[0]._M_allocated_capacity + 1);
        }
        local_5d8._M_t._M_impl._0_1_ = (Functional)0x0;
        local_5d8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_5d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_5d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_5d8._M_t._M_impl.super__Rb_tree_header._M_header;
        local_5d8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_5d8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_5d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_380._0_8_ = pTVar2;
        std::__cxx11::ostringstream::ostringstream(poVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar20,"Testing with outer tessellation level ",0x26);
        std::ostream::_M_insert<double>((double)fVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20," for the ",9);
        (anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                  ((string *)local_500,this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar20,(char *)local_500._0_8_,local_500._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar20,
                   " edge, and with various levels for other edges, and with all programs",0x45);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_380,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((TestLog *)local_500._0_8_ != (TestLog *)(local_500 + 0x10)) {
          operator_delete((void *)local_500._0_8_,local_4f0[0]._M_allocated_capacity + 1);
        }
        __last1 = (_Link_type)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream(poVar20);
        std::ios_base::~ios_base(local_308);
        pPVar23 = (this->m_programs).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(this->m_programs).
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar23) >> 3) *
            -0x55555555 < 1) {
          bVar9 = false;
        }
        else {
          lVar16 = 0;
          do {
            poVar20 = (ostringstream *)(local_380 + 8);
            dVar11 = ((pPVar23[lVar16].program.m_ptr)->m_program).m_program;
            local_640 = lVar16;
            (**(code **)(lVar22 + 0x1680))(dVar11);
            pPVar23 = pPVar23 + lVar16;
            tfPrimTypeGL = 0;
            if (pPVar23->usePointMode == false) {
              tfPrimTypeGL = 0xffffffff;
              if ((ulong)this->m_primitiveType < 3) {
                tfPrimTypeGL = *(deUint32 *)(&DAT_0094ff6c + (ulong)this->m_primitiveType * 4);
              }
            }
            iVar12 = 1;
            bindings_00 = (VertexArrayBinding *)local_558;
            TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                      (&local_608,&local_200,dVar11,tfPrimTypeGL,1,bindings_00,
                       (int)((ulong)((long)local_6b8.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_finish -
                                    (long)local_6b8.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2));
            iVar10 = multiplePatchReferenceVertexCount
                               (this->m_primitiveType,this->m_spacing,pPVar23->usePointMode,
                                local_6b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,iVar12);
            if (iVar10 == (int)((ulong)((long)local_608.varying.
                                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_608.varying.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                          -0x55555555) {
              lVar22 = 0;
              iVar10 = 0;
              do {
                local_648 = (Functional *)
                            ((long)local_6b8.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar22 * 0x18);
                outerLevels = (Functional *)
                              ((long)local_6b8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar22 * 0x18 + 8);
                primitiveType = this->m_primitiveType;
                bVar9 = pPVar23->usePointMode;
                pFVar21 = outerLevels;
                iVar13 = referencePrimitiveCount
                                   (primitiveType,this->m_spacing,bVar9,(float *)local_648,
                                    (float *)outerLevels);
                numIndentationSpaces = (int)pFVar21;
                iVar12 = 1;
                if ((bVar9 == false) && (iVar12 = -1, primitiveType < TESSPRIMITIVETYPE_LAST)) {
                  iVar12 = *(int *)(&DAT_0094ff60 + (ulong)primitiveType * 4);
                }
                local_638[0] = (Functional)0x0;
                local_638._8_4_ = _S_red;
                uVar17 = 0;
                wrapLengthParam = 0;
                local_638._16_8_ = (_Base_ptr)0x0;
                local_638._24_8_ = local_638 + 8;
                local_610 = 0;
                iVar12 = iVar12 * iVar13 + iVar10;
                local_650 = outerLevels;
                local_638._32_8_ = local_638._24_8_;
                if (iVar10 < iVar12) {
                  lVar16 = (long)iVar10;
                  do {
                    uVar14 = (ulong)this_00->numConstantCoordinateValueChoices;
                    if (0 < (long)uVar14) {
                      uVar17 = (ulong)this_00->constantCoordinateIndex;
                      fVar25 = local_608.varying.
                               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar16].m_data[uVar17];
                      if ((fVar25 != this_00->constantCoordinateValueChoices[0]) ||
                         (NAN(fVar25) || NAN(this_00->constantCoordinateValueChoices[0]))) {
                        uVar7 = 1;
                        do {
                          uVar17 = uVar7;
                          if (uVar14 == uVar17) break;
                          uVar7 = uVar17 + 1;
                        } while ((fVar25 != pfVar18[uVar17 - 1]) ||
                                (NAN(fVar25) || NAN(pfVar18[uVar17 - 1])));
                        if (uVar14 <= uVar17) goto LAB_003de74c;
                      }
                      std::
                      set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ::insert((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                *)local_638,
                               local_608.varying.
                               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar16);
                    }
LAB_003de74c:
                    numIndentationSpaces = (int)pFVar21;
                    wrapLengthParam = (int)uVar17;
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != iVar12);
                }
                sVar6 = local_610;
                iVar10 = getClampedRoundedTessLevel(this->m_spacing,fVar24);
                iVar13 = (int)bindings_00;
                if (iVar10 + 1 != (int)sVar6) {
                  poVar20 = (ostringstream *)(local_1b0 + 8);
                  local_1b0._0_8_ = pTVar2;
                  std::__cxx11::ostringstream::ostringstream(poVar20);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,"Failure: the number of vertices on outer edge is ",
                             0x31);
                  lVar22 = local_660;
                  poVar1 = (ostringstream *)(local_380 + 8);
                  std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,", expected ",0xb);
                  std::ostream::operator<<(poVar20,iVar10 + 1);
                  local_500._0_8_ =
                       tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)local_1b0,
                                  (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_500 + 8));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_500 + 8),"Note: vertices on the outer edge are:\n",
                             0x26);
                  containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                            (&local_680,(Functional *)local_638,
                             (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)0x0,wrapLengthParam,numIndentationSpaces);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_500 + 8),local_680._M_dataplus._M_p,
                             local_680._M_string_length);
                  local_380._0_8_ =
                       tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)local_500,
                                  (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::ostringstream(poVar1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"Note: the following parameters were used: ",0x2a);
                  (anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                            (&local_6a0,pPVar23);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,local_6a0._M_dataplus._M_p,local_6a0._M_string_length
                            );
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,", tessellation levels: ",0x17);
                  (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                            (&local_5a8,(_anonymous_namespace_ *)local_648,(float *)0x2,
                             (int)local_650,(float *)0x4,iVar13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,local_5a8._M_dataplus._M_p,local_5a8._M_string_length
                            );
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_380,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
                    operator_delete(local_5a8._M_dataplus._M_p,
                                    local_5a8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                    operator_delete(local_6a0._M_dataplus._M_p,
                                    local_6a0.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream(poVar1);
                  std::ios_base::~ios_base(local_308);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_680._M_dataplus._M_p != &local_680.field_2) {
                    operator_delete(local_680._M_dataplus._M_p,
                                    local_680.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_500 + 8));
                  std::ios_base::~ios_base(local_488);
                  std::__cxx11::ostringstream::~ostringstream(poVar20);
                  std::ios_base::~ios_base(local_138);
                  __last1 = (_Link_type)&DAT_00000001;
                  tcu::TestContext::setTestResult
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                             QP_TEST_RESULT_FAIL,"Invalid set of vertices");
LAB_003defa3:
                  std::
                  _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_638._16_8_,__last1);
                  goto LAB_003defb0;
                }
                if ((int)lVar22 != 0 || (int)local_640 != 0) {
                  if (local_5d8._M_t._M_impl.super__Rb_tree_header._M_node_count == sVar6) {
                    __last1 = (_Link_type)&local_5d8._M_t._M_impl.super__Rb_tree_header;
                    bVar9 = std::__equal<false>::
                            equal<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>,std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                                      ((_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                       local_5d8._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_left,(_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                               __last1,
                                       (_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                       local_638._24_8_);
                    iVar13 = (int)bindings_00;
                    if (bVar9) goto LAB_003de7d0;
                  }
                  poVar20 = (ostringstream *)(local_380 + 8);
                  local_380._0_8_ = pTVar2;
                  std::__cxx11::ostringstream::ostringstream(poVar20);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,
                             "Failure: vertices generated for the edge differ between the following cases:\n"
                             ,0x4d);
                  lVar22 = local_660;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,"  - case A: ",0xc);
                  (anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                            ((string *)local_500,
                             (this->m_programs).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                             ._M_impl.super__Vector_impl_data._M_start);
                  poVar1 = (ostringstream *)(local_380 + 8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,(char *)local_500._0_8_,local_500._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,", tessellation levels: ",0x17);
                  (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                            ((string *)local_1b0,
                             (_anonymous_namespace_ *)
                             local_6b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start,(float *)0x2,
                             (int)local_6b8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8,(float *)0x4,iVar13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,(char *)local_1b0._0_8_,local_1b0._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,"  - case B: ",0xc);
                  (anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                            (&local_680,pPVar23);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,local_680._M_dataplus._M_p,
                             local_680._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,", tessellation levels: ",0x17);
                  iVar12 = 4;
                  iVar10 = (int)local_650;
                  (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                            (&local_6a0,(_anonymous_namespace_ *)local_648,(float *)0x2,iVar10,
                             (float *)0x4,iVar13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar20,local_6a0._M_dataplus._M_p,
                             local_6a0._M_string_length);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_380,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                    operator_delete(local_6a0._M_dataplus._M_p,
                                    local_6a0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_680._M_dataplus._M_p != &local_680.field_2) {
                    operator_delete(local_680._M_dataplus._M_p,
                                    local_680.field_2._M_allocated_capacity + 1);
                  }
                  if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
                    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
                  }
                  if ((TestLog *)local_500._0_8_ != (TestLog *)(local_500 + 0x10)) {
                    operator_delete((void *)local_500._0_8_,local_4f0[0]._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream(poVar20);
                  std::ios_base::~ios_base(local_308);
                  local_380._0_8_ = pTVar2;
                  std::__cxx11::ostringstream::ostringstream(poVar1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,
                             "Note: resulting vertices for the edge for the cases were:\n",0x3a);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"  - case A: ",0xc);
                  containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                            ((string *)local_500,(Functional *)&local_5d8,
                             (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)0xe,iVar10,iVar12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,(char *)local_500._0_8_,local_500._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"  - case B: ",0xc);
                  containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                            ((string *)local_1b0,(Functional *)local_638,
                             (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)0xe,iVar10,iVar12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,(char *)local_1b0._0_8_,local_1b0._8_8_);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_380,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
                    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
                  }
                  if ((TestLog *)local_500._0_8_ != (TestLog *)(local_500 + 0x10)) {
                    operator_delete((void *)local_500._0_8_,local_4f0[0]._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream(poVar1);
                  std::ios_base::~ios_base(local_308);
                  __last1 = (_Link_type)&DAT_00000001;
                  tcu::TestContext::setTestResult
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                             QP_TEST_RESULT_FAIL,"Invalid set of vertices");
                  goto LAB_003defa3;
                }
                __last1 = (_Link_type)local_638;
                std::
                set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::operator=(&local_5d8,
                            (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)__last1);
LAB_003de7d0:
                std::
                _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)local_638._16_8_,__last1);
                lVar22 = lVar22 + 1;
                iVar10 = iVar12;
              } while (lVar22 != 10);
              bVar9 = true;
              lVar22 = local_660;
            }
            else {
              poVar1 = (ostringstream *)(local_500 + 8);
              local_500._0_8_ = pTVar2;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,
                         "Failure: the number of vertices returned by transform feedback is ",0x42);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_500 + 8),", expected ",0xb);
              std::ostream::operator<<(local_500 + 8,iVar10);
              local_380._0_8_ =
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_500,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream(poVar20);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar20,"Note: rendered ",0xf);
              std::ostream::operator<<(poVar20,10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar20,
                         " patches in one draw call; tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                         ,0x7f);
              containerStr<std::vector<float,std::allocator<float>>>
                        ((string *)local_1b0,
                         (Functional *)
                         local_6b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (vector<float,_std::allocator<float>_> *)
                         local_6b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,6,iVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar20,(char *)local_1b0._0_8_,local_1b0._8_8_);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_380,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
                operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream(poVar20);
              std::ios_base::~ios_base(local_308);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_500 + 8));
              std::ios_base::~ios_base(local_488);
              __last1 = (_Link_type)&DAT_00000001;
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_FAIL,"Invalid set of vertices");
LAB_003defb0:
              bVar9 = false;
            }
            if (local_608.varying.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              __last1 = (_Link_type)
                        ((long)local_608.varying.
                               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_608.varying.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              operator_delete(local_608.varying.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,(ulong)__last1);
            }
            if (!bVar9) break;
            lVar16 = local_640 + 1;
            pPVar23 = (this->m_programs).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (lVar16 < (int)((ulong)((long)(this->m_programs).
                                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pPVar23) >> 3) * -0x55555555);
          bVar9 = (bool)(bVar9 ^ 1);
        }
        std::
        _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    *)local_5d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__last1);
        uVar17 = local_580;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_p != &local_540) {
          operator_delete(local_550._M_p,local_540._M_allocated_capacity + 1);
        }
        if ((Functional *)
            local_6b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (Functional *)0x0) {
          operator_delete(local_6b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_6b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (bVar9) {
          glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tfPrimQuery.super_ObjectWrapper);
          glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tfBuffer.super_ObjectWrapper);
          glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tf.super_ObjectWrapper);
          goto LAB_003df111;
        }
        lVar16 = local_578 + 1;
      } while (lVar16 != 0xc);
      uVar17 = uVar17 + 1;
      pfVar18 = pfVar18 + 4;
    } while (uVar17 < local_588);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tfPrimQuery.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tfBuffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&local_200.m_tf.super_ObjectWrapper);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_003df111:
  if (local_658 != (pointer)0x0) {
    operator_delete(local_658,
                    (long)local_570.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_658);
  }
  return STOP;
}

Assistant:

InvariantOuterEdgeCase::IterateResult InvariantOuterEdgeCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const int							numPatchesPerDrawCall		= 10;
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(numPatchesPerDrawCall, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));

			for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
				maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall,
												   multiplePatchReferenceVertexCount(m_primitiveType, m_spacing, usePointModeI != 0, &patchTessLevels[0], numPatchesPerDrawCall));
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			setViewport(gl, viewport);
			gl.patchParameteri(GL_PATCH_VERTICES, 6);

			for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
			{
				const OuterEdgeDescription& edgeDesc = edgeDescriptions[outerEdgeIndex];

				for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
				{
					typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

					const vector<float>				patchTessLevels		= generatePatchTessLevels(numPatchesPerDrawCall, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };
					Vec3Set							firstOuterEdgeVertices; // Vertices of the outer edge of the first patch of the first program's draw call; used for comparison with other patches.

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges, and with all programs" << TestLog::EndMessage;

					for (int programNdx = 0; programNdx < (int)m_programs.size(); programNdx++)
					{
						const Program& program		= m_programs[programNdx];
						const deUint32 programGL	= program.program->getProgram();

						gl.useProgram(programGL);

						{
							const TFHandler::Result		tfResult			= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, program.usePointMode),
																											   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
							const int					refNumVertices		= multiplePatchReferenceVertexCount(m_primitiveType, m_spacing, program.usePointMode, &patchTessLevels[0], numPatchesPerDrawCall);
							int							numVerticesRead		= 0;

							if ((int)tfResult.varying.size() != refNumVertices)
							{
								log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
														<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
									<< TestLog::Message << "Note: rendered " << numPatchesPerDrawCall
														<< " patches in one draw call; tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
														<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

								m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
								return STOP;
							}

							// Check the vertices of each patch.

							for (int patchNdx = 0; patchNdx < numPatchesPerDrawCall; patchNdx++)
							{
								const float* const	innerLevels			= &patchTessLevels[6*patchNdx + 0];
								const float* const	outerLevels			= &patchTessLevels[6*patchNdx + 2];
								const int			patchNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, program.usePointMode, innerLevels, outerLevels);
								Vec3Set				outerEdgeVertices;

								// We're interested in just the vertices on the current outer edge.
								for(int vtxNdx = numVerticesRead; vtxNdx < numVerticesRead + patchNumVertices; vtxNdx++)
								{
									const Vec3& vtx = tfResult.varying[vtxNdx];
									if (edgeDesc.contains(vtx))
										outerEdgeVertices.insert(tfResult.varying[vtxNdx]);
								}

								// Check that the outer edge contains an appropriate number of vertices.
								{
									const int refNumVerticesOnOuterEdge = 1 + getClampedRoundedTessLevel(m_spacing, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

									if ((int)outerEdgeVertices.size() != refNumVerticesOnOuterEdge)
									{
										log << TestLog::Message << "Failure: the number of vertices on outer edge is " << outerEdgeVertices.size()
																<< ", expected " << refNumVerticesOnOuterEdge << TestLog::EndMessage
											<< TestLog::Message << "Note: vertices on the outer edge are:\n" << containerStr(outerEdgeVertices, 5, 0) << TestLog::EndMessage
											<< TestLog::Message << "Note: the following parameters were used: " << program.description()
																<< ", tessellation levels: " << tessellationLevelsString(innerLevels, outerLevels) << TestLog::EndMessage;
										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
								}

								// Compare the vertices to those of the first patch (unless this is the first patch).

								if (programNdx == 0 && patchNdx == 0)
									firstOuterEdgeVertices = outerEdgeVertices;
								else
								{
									if (firstOuterEdgeVertices != outerEdgeVertices)
									{
										log << TestLog::Message << "Failure: vertices generated for the edge differ between the following cases:\n"
																<< "  - case A: " << m_programs[0].description() << ", tessellation levels: "
																				  << tessellationLevelsString(&patchTessLevels[0], &patchTessLevels[2]) << "\n"
																<< "  - case B: " << program.description() << ", tessellation levels: "
																				  << tessellationLevelsString(innerLevels, outerLevels) << TestLog::EndMessage;

										log << TestLog::Message << "Note: resulting vertices for the edge for the cases were:\n"
																<< "  - case A: " << containerStr(firstOuterEdgeVertices, 5, 14) << "\n"
																<< "  - case B: " << containerStr(outerEdgeVertices, 5, 14) << TestLog::EndMessage;

										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
								}

								numVerticesRead += patchNumVertices;
							}

							DE_ASSERT(numVerticesRead == (int)tfResult.varying.size());
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}